

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O2

int get_regulated_q_overshoot
              (AV1_COMP *cpi,int is_encode_stage,int q_low,int q_high,int top_index,int bottom_index
              )

{
  int iVar1;
  uint uVar2;
  
  av1_rc_update_rate_correction_factors(cpi,1,(cpi->common).width,(cpi->common).height);
  if (q_high < q_low) {
    q_high = q_low;
  }
  iVar1 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,top_index,q_high,(cpi->common).width,
                            (cpi->common).height);
  for (uVar2 = 0; (iVar1 < is_encode_stage && (uVar2 < 10)); uVar2 = uVar2 + 1) {
    av1_rc_update_rate_correction_factors(cpi,1,(cpi->common).width,(cpi->common).height);
    iVar1 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,top_index,q_high,(cpi->common).width,
                              (cpi->common).height);
  }
  return iVar1;
}

Assistant:

static inline int get_regulated_q_overshoot(AV1_COMP *const cpi,
                                            int is_encode_stage, int q_low,
                                            int q_high, int top_index,
                                            int bottom_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;

  av1_rc_update_rate_correction_factors(cpi, is_encode_stage, cm->width,
                                        cm->height);

  int q_regulated =
      av1_rc_regulate_q(cpi, rc->this_frame_target, bottom_index,
                        AOMMAX(q_high, top_index), cm->width, cm->height);

  int retries = 0;
  while (q_regulated < q_low && retries < 10) {
    av1_rc_update_rate_correction_factors(cpi, is_encode_stage, cm->width,
                                          cm->height);
    q_regulated =
        av1_rc_regulate_q(cpi, rc->this_frame_target, bottom_index,
                          AOMMAX(q_high, top_index), cm->width, cm->height);
    retries++;
  }
  return q_regulated;
}